

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * google::protobuf::compiler::python::anon_unknown_0::ModuleAlias
                   (string *__return_storage_ptr__,string *filename)

{
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  undefined1 local_19;
  string *local_18;
  string *filename_local;
  string *module_name;
  
  local_19 = 0;
  local_18 = filename;
  filename_local = __return_storage_ptr__;
  ModuleName(__return_storage_ptr__,filename);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"_",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"__",&local_79);
  GlobalReplaceSubstring(&local_40,&local_78,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,".",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"_dot_",&local_c9);
  GlobalReplaceSubstring(&local_a0,&local_c8,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  return __return_storage_ptr__;
}

Assistant:

std::string ModuleAlias(const std::string& filename) {
  std::string module_name = ModuleName(filename);
  // We can't have dots in the module name, so we replace each with _dot_.
  // But that could lead to a collision between a.b and a_dot_b, so we also
  // duplicate each underscore.
  GlobalReplaceSubstring("_", "__", &module_name);
  GlobalReplaceSubstring(".", "_dot_", &module_name);
  return module_name;
}